

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O3

REF_STATUS ref_migrate_inspect(REF_MIGRATE ref_migrate)

{
  REF_NODE pRVar1;
  REF_ADJ pRVar2;
  int iVar3;
  REF_ADJ_ITEM pRVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = ref_migrate->max;
  if (0 < iVar3) {
    pRVar1 = ref_migrate->grid->node;
    lVar6 = 0;
    do {
      if (ref_migrate->global[lVar6] != -1) {
        lVar5 = -1;
        if ((lVar6 < pRVar1->max) && (lVar5 = pRVar1->global[lVar6], lVar5 < 0)) {
          lVar5 = -1;
        }
        printf(" %2d : %ld :",(ulong)(uint)pRVar1->ref_mpi->id,lVar5);
        pRVar2 = ref_migrate->parent_local;
        if ((lVar6 < pRVar2->nnode) && (iVar3 = pRVar2->first[lVar6], iVar3 != -1)) {
          pRVar4 = pRVar2->item;
          do {
            printf(" %ld+%d",ref_migrate->global[pRVar4[iVar3].ref],
                   (ulong)(uint)ref_migrate->parent_part->item[iVar3].ref);
            pRVar4 = ref_migrate->parent_local->item;
            iVar3 = pRVar4[iVar3].next;
          } while (iVar3 != -1);
        }
        putchar(10);
        iVar3 = ref_migrate->max;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_inspect(REF_MIGRATE ref_migrate) {
  REF_NODE ref_node = ref_grid_node(ref_migrate_grid(ref_migrate));
  REF_INT node, item, local, part;
  REF_GLOB global;

  each_ref_migrate_node(ref_migrate, node) {
    printf(" %2d : " REF_GLOB_FMT " :", ref_mpi_rank(ref_node_mpi(ref_node)),
           ref_node_global(ref_node, node));
    each_ref_adj_node_item_with_ref(ref_migrate_parent_local(ref_migrate), node,
                                    item, local) {
      global = ref_migrate_global(ref_migrate, local);
      part = ref_adj_item_ref(ref_migrate_parent_part(ref_migrate), item);
      printf(" " REF_GLOB_FMT "+%d", global, part);
    }
    printf("\n");
  }
  return REF_SUCCESS;
}